

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void capnp::_::anon_unknown_129::dynamicCheckTestMessageAllZero<capnp::DynamicStruct::Builder>
               (Builder reader)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar39;
  BuilderFor<bool> BVar40;
  int8_t iVar41;
  uint8_t uVar42;
  int16_t iVar43;
  uint16_t uVar44;
  int32_t iVar45;
  uint32_t uVar46;
  int64_t iVar47;
  uint64_t uVar48;
  float fVar49;
  double dVar50;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar51;
  undefined4 uVar52;
  Builder BVar53;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  StringPtr name_64;
  StringPtr name_65;
  StringPtr name_66;
  StringPtr name_67;
  StringPtr name_68;
  StringPtr name_69;
  StringPtr name_70;
  StringPtr name_71;
  StringPtr name_72;
  StringPtr name_73;
  StringPtr name_74;
  StringPtr name_75;
  StringPtr name_76;
  StringPtr name_77;
  StringPtr name_78;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  StringPtr name_84;
  StringPtr name_85;
  StringPtr name_86;
  StringPtr name_87;
  StringPtr name_88;
  StringPtr name_89;
  StringPtr name_90;
  StringPtr name_91;
  StringPtr name_92;
  StringPtr name_93;
  StringPtr name_94;
  StringPtr name_95;
  StringPtr name_96;
  StringPtr name_97;
  StringPtr name_98;
  StringPtr name_99;
  StringPtr name_x00100;
  StringPtr name_x00101;
  StringPtr name_x00102;
  StringPtr name_x00103;
  StringPtr name_x00104;
  StringPtr name_x00105;
  StringPtr name_x00106;
  StringPtr name_x00107;
  StringPtr name_x00108;
  StringPtr name_x00109;
  StringPtr name_x00110;
  StringPtr name_x00111;
  StringPtr name_x00112;
  StringPtr name_x00113;
  StringPtr name_x00114;
  StringPtr name_x00115;
  StringPtr name_x00116;
  StringPtr name_x00117;
  StringPtr name_x00118;
  StringPtr name_x00119;
  StringPtr name_x00120;
  BuilderFor<capnp::DynamicStruct> subReader;
  BuilderFor<capnp::DynamicStruct> subSubReader;
  Builder local_170;
  Builder local_130;
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  double local_90;
  double local_88;
  undefined4 uStack_80;
  uint uStack_7c;
  BuilderFor<DynamicStruct> local_78;
  BuilderFor<Text> local_48;
  
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  name_00.content.size_ = 10;
  name_00.content.ptr = "boolField";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_00);
  BVar40 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if (BVar40 && kj::_::Debug::minSeverity < 3) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    name_01.content.size_ = 10;
    name_01.content.ptr = "boolField";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_01);
    local_f0[0] = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[74],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x20c,ERROR,
               "\"failed: expected \" \"(false) == (reader.get(\\\"boolField\\\").template as<bool>())\", false, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [74])
                "failed: expected (false) == (reader.get(\"boolField\").template as<bool>())",
               (bool *)&local_130,(bool *)local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_02.content.size_ = 10;
  name_02.content.ptr = "int8Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_02);
  iVar41 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar41 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_03.content.size_ = 10;
    name_03.content.ptr = "int8Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_03);
    iVar41 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_170);
    local_f0[0] = iVar41;
    kj::_::Debug::log<char_const(&)[72],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x20d,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", 0, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [72])
                "failed: expected (0) == (reader.get(\"int8Field\").template as<int8_t>())",
               (int *)&local_130,local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_04.content.size_ = 0xb;
  name_04.content.ptr = "int16Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_04);
  iVar43 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar43 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_05.content.size_ = 0xb;
    name_05.content.ptr = "int16Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_05);
    iVar43 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply(&local_170);
    local_f0._0_2_ = iVar43;
    kj::_::Debug::log<char_const(&)[74],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x20e,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", 0, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [74])
                "failed: expected (0) == (reader.get(\"int16Field\").template as<int16_t>())",
               (int *)&local_130,(short *)local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_06.content.size_ = 0xb;
  name_06.content.ptr = "int32Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_06);
  iVar45 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar45 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_07.content.size_ = 0xb;
    name_07.content.ptr = "int32Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_07);
    iVar45 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply(&local_170);
    local_f0._0_4_ = iVar45;
    kj::_::Debug::log<char_const(&)[74],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x20f,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", 0, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [74])
                "failed: expected (0) == (reader.get(\"int32Field\").template as<int32_t>())",
               (int *)&local_130,(int *)local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_08.content.size_ = 0xb;
  name_08.content.ptr = "int64Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_08);
  iVar47 = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar47 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar1._12_4_ = 0;
    auVar1._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar1 << 0x20;
    name_09.content.size_ = 0xb;
    name_09.content.ptr = "int64Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_09);
    local_130._0_8_ = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[74],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x210,ERROR,
               "\"failed: expected \" \"(0) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", 0, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [74])
                "failed: expected (0) == (reader.get(\"int64Field\").template as<int64_t>())",
               (int *)local_f0,(long *)&local_130);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_10.content.size_ = 0xb;
  name_10.content.ptr = "uInt8Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_10);
  uVar42 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar42 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_11.content.size_ = 0xb;
    name_11.content.ptr = "uInt8Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_11);
    uVar42 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_170);
    local_f0[0] = uVar42;
    kj::_::Debug::log<char_const(&)[75],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x211,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 0u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [75])
                "failed: expected (0u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               &local_130.type,local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_12.content.size_ = 0xc;
  name_12.content.ptr = "uInt16Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_12);
  uVar44 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar44 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_13.content.size_ = 0xc;
    name_13.content.ptr = "uInt16Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_13);
    uVar44 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_170);
    local_f0._0_2_ = uVar44;
    kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x212,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 0u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [77])
                "failed: expected (0u) == (reader.get(\"uInt16Field\").template as<uint16_t>())",
               &local_130.type,(unsigned_short *)local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_14.content.size_ = 0xc;
  name_14.content.ptr = "uInt32Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_14);
  uVar46 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar46 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_15.content.size_ = 0xc;
    name_15.content.ptr = "uInt32Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_15);
    uVar46 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_170);
    local_f0._0_4_ = uVar46;
    kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x213,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 0u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [77])
                "failed: expected (0u) == (reader.get(\"uInt32Field\").template as<uint32_t>())",
               &local_130.type,(uint *)local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_16.content.size_ = 0xc;
  name_16.content.ptr = "uInt64Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_16);
  uVar48 = DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar48 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar2._12_4_ = 0;
    auVar2._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar2 << 0x20;
    name_17.content.size_ = 0xc;
    name_17.content.ptr = "uInt64Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_17);
    local_130._0_8_ =
         DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x214,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 0u, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [77])
                "failed: expected (0u) == (reader.get(\"uInt64Field\").template as<uint64_t>())",
               (uint *)local_f0,(unsigned_long *)&local_130);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_18.content.size_ = 0xd;
  name_18.content.ptr = "float32Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_18);
  fVar49 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply(&local_170);
  if ((fVar49 != 0.0) || (NAN(fVar49))) {
    fVar51 = -fVar49;
    if (-fVar49 <= fVar49) {
      fVar51 = fVar49;
    }
    local_88 = (double)fVar51;
    local_90 = local_88 * 1e-05;
    DynamicValue::Builder::~Builder(&local_170);
    if ((local_90 <= local_88) && (kj::_::Debug::minSeverity < 3)) {
      name_19.content.size_ = 0xd;
      name_19.content.ptr = "float32Field";
      DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_19);
      fVar49 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply(&local_170);
      local_130.type = (Type)fVar49;
      auVar3._12_4_ = 0;
      auVar3._0_12_ = local_f0._4_12_;
      local_f0._0_16_ = auVar3 << 0x20;
      kj::_::Debug::log<char_const(&)[95],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x215,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 0)\", reader.get(\"float32Field\").template as<float>(), 0"
                 ,(char (*) [95])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 0)"
                 ,(float *)&local_130,(int *)local_f0);
      goto LAB_00249d25;
    }
  }
  else {
LAB_00249d25:
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_20.content.size_ = 0xd;
  name_20.content.ptr = "float64Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_20);
  dVar50 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply(&local_170);
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    uVar52 = (undefined4)((ulong)-dVar50 >> 0x20);
    uStack_7c = (uint)((ulong)extraout_XMM0_Qb >> 0x20) ^ 0x80000000;
    uStack_80 = (undefined4)extraout_XMM0_Qb;
    if (-dVar50 <= dVar50) {
      uVar52 = (undefined4)((ulong)dVar50 >> 0x20);
    }
    local_88 = (double)CONCAT44(uVar52,SUB84(dVar50,0));
    local_90 = (double)CONCAT44(uVar52,SUB84(dVar50,0)) * 1e-12;
    DynamicValue::Builder::~Builder(&local_170);
    if ((local_90 <= local_88) && (kj::_::Debug::minSeverity < 3)) {
      name_21.content.size_ = 0xd;
      name_21.content.ptr = "float64Field";
      DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_21);
      local_130._0_8_ = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply(&local_170);
      auVar4._12_4_ = 0;
      auVar4._0_12_ = local_f0._4_12_;
      local_f0._0_16_ = auVar4 << 0x20;
      kj::_::Debug::log<char_const(&)[97],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x216,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), 0)\", reader.get(\"float64Field\").template as<double>(), 0"
                 ,(char (*) [97])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), 0)"
                 ,(double *)&local_130,(int *)local_f0);
      goto LAB_00249e1a;
    }
  }
  else {
LAB_00249e1a:
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_22.content.size_ = 10;
  name_22.content.ptr = "textField";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_22);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&local_130,&local_170);
  uVar39 = local_130.field_1.textValue.content.ptr;
  DynamicValue::Builder::~Builder(&local_170);
  if (((char *)uVar39 != (char *)0x1) && (kj::_::Debug::minSeverity < 3)) {
    name_23.content.size_ = 10;
    name_23.content.ptr = "textField";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_23);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&local_130,&local_170);
    kj::_::Debug::log<char_const(&)[71],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x217,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", \"\", reader.get(\"textField\").template as<Text>()"
               ,(char (*) [71])
                "failed: expected (\"\") == (reader.get(\"textField\").template as<Text>())",
               (char (*) [1])0x31ccc1,(Builder *)&local_130);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_24.content.size_ = 10;
  name_24.content.ptr = "dataField";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_24);
  BVar53 = DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((BVar53.super_ArrayPtr<unsigned_char>.size_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = "";
    local_130.field_1.intValue = 0;
    name_25.content.size_ = 10;
    name_25.content.ptr = "dataField";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_25);
    local_f0._0_16_ =
         (undefined1  [16])
         DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[77],capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x218,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", data(\"\"), reader.get(\"dataField\").template as<Data>()"
               ,(char (*) [77])
                "failed: expected (data(\"\")) == (reader.get(\"dataField\").template as<Data>())",
               (Reader *)&local_130,(Builder *)local_f0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_26.content.size_ = 0xc;
  name_26.content.ptr = "structField";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_26);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_f0,&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  name_27.content.size_ = 10;
  name_27.content.ptr = "voidField";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_27);
  DynamicValue::Builder::AsImpl<capnp::Void,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  name_28.content.size_ = 10;
  name_28.content.ptr = "boolField";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_28);
  BVar40 = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if (BVar40 && kj::_::Debug::minSeverity < 3) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
    name_29.content.size_ = 10;
    name_29.content.ptr = "boolField";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_29);
    local_c0[0] = DynamicValue::Builder::AsImpl<bool,_(capnp::Kind)0>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[77],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21c,ERROR,
               "\"failed: expected \" \"(false) == (subReader.get(\\\"boolField\\\").template as<bool>())\", false, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [77])
                "failed: expected (false) == (subReader.get(\"boolField\").template as<bool>())",
               (bool *)&local_130,(bool *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "int8Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_30);
  iVar41 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar41 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_31.content.size_ = 10;
    name_31.content.ptr = "int8Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_31);
    iVar41 = DynamicValue::Builder::AsImpl<signed_char,_(capnp::Kind)0>::apply(&local_170);
    local_c0[0] = iVar41;
    kj::_::Debug::log<char_const(&)[75],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21d,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", 0, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (0) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (int *)&local_130,local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_32.content.size_ = 0xb;
  name_32.content.ptr = "int16Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_32);
  iVar43 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar43 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_33.content.size_ = 0xb;
    name_33.content.ptr = "int16Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_33);
    iVar43 = DynamicValue::Builder::AsImpl<short,_(capnp::Kind)0>::apply(&local_170);
    local_c0._0_2_ = iVar43;
    kj::_::Debug::log<char_const(&)[77],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21e,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", 0, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [77])
                "failed: expected (0) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (int *)&local_130,(short *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int32Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_34);
  iVar45 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar45 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int32Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_35);
    iVar45 = DynamicValue::Builder::AsImpl<int,_(capnp::Kind)0>::apply(&local_170);
    local_c0._0_4_ = iVar45;
    kj::_::Debug::log<char_const(&)[77],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x21f,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", 0, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [77])
                "failed: expected (0) == (subReader.get(\"int32Field\").template as<int32_t>())",
               (int *)&local_130,(int *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int64Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_36);
  iVar47 = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((iVar47 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar5._12_4_ = 0;
    auVar5._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar5 << 0x20;
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int64Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_37);
    local_130._0_8_ = DynamicValue::Builder::AsImpl<long,_(capnp::Kind)0>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[77],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x220,ERROR,
               "\"failed: expected \" \"(0) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", 0, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [77])
                "failed: expected (0) == (subReader.get(\"int64Field\").template as<int64_t>())",
               (int *)local_c0,(long *)&local_130);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "uInt8Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_38);
  uVar42 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar42 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "uInt8Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_39);
    uVar42 = DynamicValue::Builder::AsImpl<unsigned_char,_(capnp::Kind)0>::apply(&local_170);
    local_c0[0] = uVar42;
    kj::_::Debug::log<char_const(&)[78],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x221,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 0u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [78])
                "failed: expected (0u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               &local_130.type,local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_40.content.size_ = 0xc;
  name_40.content.ptr = "uInt16Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_40);
  uVar44 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar44 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_41.content.size_ = 0xc;
    name_41.content.ptr = "uInt16Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_41);
    uVar44 = DynamicValue::Builder::AsImpl<unsigned_short,_(capnp::Kind)0>::apply(&local_170);
    local_c0._0_2_ = uVar44;
    kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x222,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 0u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [80])
                "failed: expected (0u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())",
               &local_130.type,(unsigned_short *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt32Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_42);
  uVar46 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar46 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt32Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_43);
    uVar46 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply(&local_170);
    local_c0._0_4_ = uVar46;
    kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x223,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 0u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [80])
                "failed: expected (0u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())",
               &local_130.type,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt64Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_44);
  uVar48 = DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar48 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar6 << 0x20;
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt64Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_45);
    local_130._0_8_ =
         DynamicValue::Builder::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x224,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 0u, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [80])
                "failed: expected (0u) == (subReader.get(\"uInt64Field\").template as<uint64_t>())",
               (uint *)local_c0,(unsigned_long *)&local_130);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_46.content.size_ = 0xd;
  name_46.content.ptr = "float32Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_46);
  fVar49 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply(&local_170);
  if ((fVar49 != 0.0) || (NAN(fVar49))) {
    fVar51 = -fVar49;
    if (-fVar49 <= fVar49) {
      fVar51 = fVar49;
    }
    local_88 = (double)fVar51;
    local_90 = local_88 * 1e-05;
    DynamicValue::Builder::~Builder(&local_170);
    if ((local_90 <= local_88) && (kj::_::Debug::minSeverity < 3)) {
      name_47.content.size_ = 0xd;
      name_47.content.ptr = "float32Field";
      DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_47);
      fVar49 = DynamicValue::Builder::AsImpl<float,_(capnp::Kind)0>::apply(&local_170);
      local_130.type = (Type)fVar49;
      auVar7._12_4_ = 0;
      auVar7._0_12_ = local_c0._4_12_;
      local_c0._0_16_ = auVar7 << 0x20;
      kj::_::Debug::log<char_const(&)[98],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x225,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), 0)\", subReader.get(\"float32Field\").template as<float>(), 0"
                 ,(char (*) [98])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), 0)"
                 ,(float *)&local_130,(int *)local_c0);
      goto LAB_0024a740;
    }
  }
  else {
LAB_0024a740:
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float64Field";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_48);
  dVar50 = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply(&local_170);
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    uVar52 = (undefined4)((ulong)-dVar50 >> 0x20);
    uStack_7c = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20) ^ 0x80000000;
    uStack_80 = (undefined4)extraout_XMM0_Qb_00;
    if (-dVar50 <= dVar50) {
      uVar52 = (undefined4)((ulong)dVar50 >> 0x20);
    }
    local_88 = (double)CONCAT44(uVar52,SUB84(dVar50,0));
    local_90 = (double)CONCAT44(uVar52,SUB84(dVar50,0)) * 1e-12;
    DynamicValue::Builder::~Builder(&local_170);
    if ((local_88 < local_90) || (2 < kj::_::Debug::minSeverity)) goto LAB_0024a849;
    name_49.content.size_ = 0xd;
    name_49.content.ptr = "float64Field";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_49);
    local_130._0_8_ = DynamicValue::Builder::AsImpl<double,_(capnp::Kind)0>::apply(&local_170);
    auVar8._12_4_ = 0;
    auVar8._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar8 << 0x20;
    kj::_::Debug::log<char_const(&)[100],double,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x226,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 0)\", subReader.get(\"float64Field\").template as<double>(), 0"
               ,(char (*) [100])
                "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 0)"
               ,(double *)&local_130,(int *)local_c0);
  }
  DynamicValue::Builder::~Builder(&local_170);
LAB_0024a849:
  name_50.content.size_ = 10;
  name_50.content.ptr = "textField";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_50);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&local_130,&local_170);
  uVar39 = local_130.field_1.textValue.content.ptr;
  DynamicValue::Builder::~Builder(&local_170);
  if (((char *)uVar39 != (char *)0x1) && (kj::_::Debug::minSeverity < 3)) {
    name_51.content.size_ = 10;
    name_51.content.ptr = "textField";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_51);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&local_130,&local_170);
    kj::_::Debug::log<char_const(&)[74],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x227,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", \"\", subReader.get(\"textField\").template as<Text>()"
               ,(char (*) [74])
                "failed: expected (\"\") == (subReader.get(\"textField\").template as<Text>())",
               (char (*) [1])0x31ccc1,(Builder *)&local_130);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_52.content.size_ = 10;
  name_52.content.ptr = "dataField";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_52);
  BVar53 = DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((BVar53.super_ArrayPtr<unsigned_char>.size_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_130._0_8_ = "";
    local_130.field_1.intValue = 0;
    name_53.content.size_ = 10;
    name_53.content.ptr = "dataField";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_53);
    local_c0._0_16_ =
         (undefined1  [16])
         DynamicValue::Builder::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(&local_170);
    kj::_::Debug::log<char_const(&)[80],capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x228,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", data(\"\"), subReader.get(\"dataField\").template as<Data>()"
               ,(char (*) [80])
                "failed: expected (data(\"\")) == (subReader.get(\"dataField\").template as<Data>())"
               ,(Reader *)&local_130,(Builder *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_54.content.size_ = 0xc;
  name_54.content.ptr = "structField";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_54);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_c0,&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  name_55.content.size_ = 10;
  name_55.content.ptr = "textField";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_c0,name_55);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
            ((BuilderFor<Text> *)&local_130,&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  if ((local_130.field_1.textValue.content.ptr != (char *)0x1) && (kj::_::Debug::minSeverity < 3)) {
    name_56.content.size_ = 10;
    name_56.content.ptr = "textField";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_c0,name_56);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
              ((BuilderFor<Text> *)&local_130,&local_170);
    kj::_::Debug::log<char_const(&)[77],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x22b,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", \"\", subSubReader.get(\"textField\").template as<Text>()"
               ,(char (*) [77])
                "failed: expected (\"\") == (subSubReader.get(\"textField\").template as<Text>())",
               (char (*) [1])0x31ccc1,(Builder *)&local_130);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_57.content.size_ = 0xc;
  name_57.content.ptr = "structField";
  DynamicStruct::Builder::get(&local_130,(Builder *)local_c0,name_57);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_78,&local_130);
  name_58.content.size_ = 10;
  name_58.content.ptr = "textField";
  DynamicStruct::Builder::get(&local_170,&local_78,name_58);
  DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_48,&local_170);
  DynamicValue::Builder::~Builder(&local_170);
  DynamicValue::Builder::~Builder(&local_130);
  if ((local_48.content.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    name_59.content.size_ = 0xc;
    name_59.content.ptr = "structField";
    DynamicStruct::Builder::get(&local_130,(Builder *)local_c0,name_59);
    DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_78,&local_130)
    ;
    name_60.content.size_ = 10;
    name_60.content.ptr = "textField";
    DynamicStruct::Builder::get(&local_170,&local_78,name_60);
    DynamicValue::Builder::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(&local_48,&local_170);
    kj::_::Debug::log<char_const(&)[126],char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x22d,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", \"\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [126])
                "failed: expected (\"\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,(char (*) [1])0x31ccc1,&local_48);
    DynamicValue::Builder::~Builder(&local_170);
    DynamicValue::Builder::~Builder(&local_130);
  }
  name_61.content.size_ = 9;
  name_61.content.ptr = "voidList";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_61);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar9 << 0x20;
    name_62.content.size_ = 9;
    name_62.content.ptr = "voidList";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_62);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x230,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"voidList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"voidList\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_63.content.size_ = 9;
  name_63.content.ptr = "boolList";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_63);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar10._12_4_ = 0;
    auVar10._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar10 << 0x20;
    name_64.content.size_ = 9;
    name_64.content.ptr = "boolList";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_64);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x231,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"boolList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"boolList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"boolList\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_65.content.size_ = 9;
  name_65.content.ptr = "int8List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_65);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar11._12_4_ = 0;
    auVar11._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar11 << 0x20;
    name_66.content.size_ = 9;
    name_66.content.ptr = "int8List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_66);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x232,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int8List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int8List\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"int8List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_67.content.size_ = 10;
  name_67.content.ptr = "int16List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_67);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar12._12_4_ = 0;
    auVar12._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar12 << 0x20;
    name_68.content.size_ = 10;
    name_68.content.ptr = "int16List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_68);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int16List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int16List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"int16List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_69.content.size_ = 10;
  name_69.content.ptr = "int32List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_69);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar13._12_4_ = 0;
    auVar13._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar13 << 0x20;
    name_70.content.size_ = 10;
    name_70.content.ptr = "int32List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_70);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x234,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int32List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int32List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"int32List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_71.content.size_ = 10;
  name_71.content.ptr = "int64List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_71);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar14._12_4_ = 0;
    auVar14._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar14 << 0x20;
    name_72.content.size_ = 10;
    name_72.content.ptr = "int64List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_72);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x235,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"int64List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"int64List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"int64List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_73.content.size_ = 10;
  name_73.content.ptr = "uInt8List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_73);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar15._12_4_ = 0;
    auVar15._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar15 << 0x20;
    name_74.content.size_ = 10;
    name_74.content.ptr = "uInt8List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_74);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[88],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x236,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt8List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt8List\").template as<DynamicList>().size()"
               ,(char (*) [88])
                "failed: expected (0u) == (subReader.get(\"uInt8List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_75.content.size_ = 0xb;
  name_75.content.ptr = "uInt16List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_75);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar16._12_4_ = 0;
    auVar16._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar16 << 0x20;
    name_76.content.size_ = 0xb;
    name_76.content.ptr = "uInt16List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_76);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x237,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt16List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt16List\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"uInt16List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_77.content.size_ = 0xb;
  name_77.content.ptr = "uInt32List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_77);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar17._12_4_ = 0;
    auVar17._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar17 << 0x20;
    name_78.content.size_ = 0xb;
    name_78.content.ptr = "uInt32List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_78);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x238,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt32List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt32List\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"uInt32List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_79.content.size_ = 0xb;
  name_79.content.ptr = "uInt64List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_79);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar18._12_4_ = 0;
    auVar18._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar18 << 0x20;
    name_80.content.size_ = 0xb;
    name_80.content.ptr = "uInt64List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_80);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x239,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"uInt64List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"uInt64List\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"uInt64List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_81.content.size_ = 0xc;
  name_81.content.ptr = "float32List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_81);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar19._12_4_ = 0;
    auVar19._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar19 << 0x20;
    name_82.content.size_ = 0xc;
    name_82.content.ptr = "float32List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_82);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[90],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23a,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"float32List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"float32List\").template as<DynamicList>().size()"
               ,(char (*) [90])
                "failed: expected (0u) == (subReader.get(\"float32List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_83.content.size_ = 0xc;
  name_83.content.ptr = "float64List";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_83);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar20._12_4_ = 0;
    auVar20._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar20 << 0x20;
    name_84.content.size_ = 0xc;
    name_84.content.ptr = "float64List";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_84);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[90],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23b,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"float64List\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"float64List\").template as<DynamicList>().size()"
               ,(char (*) [90])
                "failed: expected (0u) == (subReader.get(\"float64List\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_85.content.size_ = 9;
  name_85.content.ptr = "textList";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_85);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar21._12_4_ = 0;
    auVar21._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar21 << 0x20;
    name_86.content.size_ = 9;
    name_86.content.ptr = "textList";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_86);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23c,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"textList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"textList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"textList\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_87.content.size_ = 9;
  name_87.content.ptr = "dataList";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_87);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar22._12_4_ = 0;
    auVar22._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar22 << 0x20;
    name_88.content.size_ = 9;
    name_88.content.ptr = "dataList";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_88);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23d,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"dataList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"dataList\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (subReader.get(\"dataList\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_89.content.size_ = 0xb;
  name_89.content.ptr = "structList";
  DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_89);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar23._12_4_ = 0;
    auVar23._0_12_ = local_c0._4_12_;
    local_c0._0_16_ = auVar23 << 0x20;
    name_90.content.size_ = 0xb;
    name_90.content.ptr = "structList";
    DynamicStruct::Builder::get(&local_170,(Builder *)local_f0,name_90);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_78.schema.super_Schema.raw._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x23e,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.get(\\\"structList\\\").template as<DynamicList>().size())\", 0u, subReader.get(\"structList\").template as<DynamicList>().size()"
               ,(char (*) [89])
                "failed: expected (0u) == (subReader.get(\"structList\").template as<DynamicList>().size())"
               ,(uint *)local_c0,(uint *)&local_78);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_91.content.size_ = 9;
  name_91.content.ptr = "voidList";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_91);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar24._12_4_ = 0;
    auVar24._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar24 << 0x20;
    name_92.content.size_ = 9;
    name_92.content.ptr = "voidList";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_92);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"voidList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_93.content.size_ = 9;
  name_93.content.ptr = "boolList";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_93);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar25._12_4_ = 0;
    auVar25._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar25 << 0x20;
    name_94.content.size_ = 9;
    name_94.content.ptr = "boolList";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_94);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x242,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"boolList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"boolList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"boolList\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_95.content.size_ = 9;
  name_95.content.ptr = "int8List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_95);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar26._12_4_ = 0;
    auVar26._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar26 << 0x20;
    name_96.content.size_ = 9;
    name_96.content.ptr = "int8List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_96);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x243,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int8List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int8List\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"int8List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_97.content.size_ = 10;
  name_97.content.ptr = "int16List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_97);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar27._12_4_ = 0;
    auVar27._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar27 << 0x20;
    name_98.content.size_ = 10;
    name_98.content.ptr = "int16List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_98);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x244,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int16List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int16List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"int16List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_99.content.size_ = 10;
  name_99.content.ptr = "int32List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_99);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar28._12_4_ = 0;
    auVar28._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar28 << 0x20;
    name_x00100.content.size_ = 10;
    name_x00100.content.ptr = "int32List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00100);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x245,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int32List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int32List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"int32List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00101.content.size_ = 10;
  name_x00101.content.ptr = "int64List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00101);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar29._12_4_ = 0;
    auVar29._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar29 << 0x20;
    name_x00102.content.size_ = 10;
    name_x00102.content.ptr = "int64List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00102);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x246,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"int64List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"int64List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"int64List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00103.content.size_ = 10;
  name_x00103.content.ptr = "uInt8List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00103);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar30._12_4_ = 0;
    auVar30._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar30 << 0x20;
    name_x00104.content.size_ = 10;
    name_x00104.content.ptr = "uInt8List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00104);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[85],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x247,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt8List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt8List\").template as<DynamicList>().size()"
               ,(char (*) [85])
                "failed: expected (0u) == (reader.get(\"uInt8List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00105.content.size_ = 0xb;
  name_x00105.content.ptr = "uInt16List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00105);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar31._12_4_ = 0;
    auVar31._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar31 << 0x20;
    name_x00106.content.size_ = 0xb;
    name_x00106.content.ptr = "uInt16List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00106);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x248,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt16List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt16List\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"uInt16List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00107.content.size_ = 0xb;
  name_x00107.content.ptr = "uInt32List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00107);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar32._12_4_ = 0;
    auVar32._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar32 << 0x20;
    name_x00108.content.size_ = 0xb;
    name_x00108.content.ptr = "uInt32List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00108);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x249,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt32List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt32List\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"uInt32List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00109.content.size_ = 0xb;
  name_x00109.content.ptr = "uInt64List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00109);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar33._12_4_ = 0;
    auVar33._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar33 << 0x20;
    name_x00110.content.size_ = 0xb;
    name_x00110.content.ptr = "uInt64List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00110);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24a,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"uInt64List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"uInt64List\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"uInt64List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00111.content.size_ = 0xc;
  name_x00111.content.ptr = "float32List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00111);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar34._12_4_ = 0;
    auVar34._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar34 << 0x20;
    name_x00112.content.size_ = 0xc;
    name_x00112.content.ptr = "float32List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00112);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24b,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"float32List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"float32List\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (reader.get(\"float32List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00113.content.size_ = 0xc;
  name_x00113.content.ptr = "float64List";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00113);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar35._12_4_ = 0;
    auVar35._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar35 << 0x20;
    name_x00114.content.size_ = 0xc;
    name_x00114.content.ptr = "float64List";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00114);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24c,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"float64List\\\").template as<DynamicList>().size())\", 0u, reader.get(\"float64List\").template as<DynamicList>().size()"
               ,(char (*) [87])
                "failed: expected (0u) == (reader.get(\"float64List\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00115.content.size_ = 9;
  name_x00115.content.ptr = "textList";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00115);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar36._12_4_ = 0;
    auVar36._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar36 << 0x20;
    name_x00116.content.size_ = 9;
    name_x00116.content.ptr = "textList";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00116);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24d,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"textList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"textList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"textList\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00117.content.size_ = 9;
  name_x00117.content.ptr = "dataList";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00117);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar37._12_4_ = 0;
    auVar37._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar37 << 0x20;
    name_x00118.content.size_ = 9;
    name_x00118.content.ptr = "dataList";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00118);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24e,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"dataList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"dataList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (0u) == (reader.get(\"dataList\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  name_x00119.content.size_ = 0xb;
  name_x00119.content.ptr = "structList";
  DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00119);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_130,&local_170);
  uVar52 = local_130.field_1._32_4_;
  DynamicValue::Builder::~Builder(&local_170);
  if ((uVar52 != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar38._12_4_ = 0;
    auVar38._0_12_ = local_f0._4_12_;
    local_f0._0_16_ = auVar38 << 0x20;
    name_x00120.content.size_ = 0xb;
    name_x00120.content.ptr = "structList";
    DynamicStruct::Builder::get(&local_170,(Builder *)&stack0x00000008,name_x00120);
    DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((BuilderFor<DynamicList> *)&local_130,&local_170);
    local_c0._0_4_ = local_130.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x24f,ERROR,
               "\"failed: expected \" \"(0u) == (reader.get(\\\"structList\\\").template as<DynamicList>().size())\", 0u, reader.get(\"structList\").template as<DynamicList>().size()"
               ,(char (*) [86])
                "failed: expected (0u) == (reader.get(\"structList\").template as<DynamicList>().size())"
               ,(uint *)local_f0,(uint *)local_c0);
    DynamicValue::Builder::~Builder(&local_170);
  }
  return;
}

Assistant:

void dynamicCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(false, reader.get("boolField").as<bool>());
  EXPECT_EQ(0, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(0, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(0, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(0, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(0u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(0u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(0u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(0u, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(0, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(0, reader.get("float64Field").as<double>());
  EXPECT_EQ("", reader.get("textField").as<Text>());
  EXPECT_EQ(data(""), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(false, subReader.get("boolField").as<bool>());
    EXPECT_EQ(0, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(0, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(0, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(0, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(0u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(0u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(0u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(0u, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(0, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(0, subReader.get("float64Field").as<double>());
    EXPECT_EQ("", subReader.get("textField").as<Text>());
    EXPECT_EQ(data(""), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("", subSubReader.get("structField").as<DynamicStruct>()
                                .get("textField").as<Text>());
    }

    EXPECT_EQ(0u, subReader.get("voidList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("boolList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int8List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int16List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("int64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt8List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt16List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("uInt64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("float32List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("float64List").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("textList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("dataList").as<DynamicList>().size());
    EXPECT_EQ(0u, subReader.get("structList").as<DynamicList>().size());
  }

  EXPECT_EQ(0u, reader.get("voidList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("boolList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int8List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int16List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("int64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt8List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt16List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("uInt64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("float32List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("float64List").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("textList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("dataList").as<DynamicList>().size());
  EXPECT_EQ(0u, reader.get("structList").as<DynamicList>().size());
}